

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetIncludeDirectoriesCommand.cxx
# Opt level: O2

string * __thiscall
cmTargetIncludeDirectoriesCommand::Join
          (string *__return_storage_ptr__,cmTargetIncludeDirectoriesCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content)

{
  pointer pbVar1;
  bool bVar2;
  string *__lhs;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  pointer in_name;
  string prefix;
  string sep;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_90.field_2._M_local_buf[0] = '\0';
  __lhs = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                    ((this->super_cmTargetPropCommandBase).super_cmCommand.Makefile);
  std::operator+(&local_b0,__lhs,"/");
  in_name = (content->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (content->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (in_name == pbVar1) {
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      return __return_storage_ptr__;
    }
    bVar2 = cmsys::SystemTools::FileIsFullPath(in_name);
    if (bVar2) {
LAB_00235099:
      std::operator+(&local_50,&local_90,in_name);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      this_00 = &local_50;
    }
    else {
      sVar3 = cmGeneratorExpression::Find(in_name);
      if (sVar3 == 0) goto LAB_00235099;
      std::operator+(&local_70,&local_90,&local_b0);
      std::operator+(&local_50,&local_70,in_name);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_50);
      this_00 = &local_70;
    }
    std::__cxx11::string::~string((string *)this_00);
    std::__cxx11::string::assign((char *)&local_90);
    in_name = in_name + 1;
  } while( true );
}

Assistant:

std::string cmTargetIncludeDirectoriesCommand::Join(
  const std::vector<std::string>& content)
{
  std::string dirs;
  std::string sep;
  std::string prefix = this->Makefile->GetCurrentSourceDirectory() + "/";
  for (std::string const& it : content) {
    if (cmSystemTools::FileIsFullPath(it) ||
        cmGeneratorExpression::Find(it) == 0) {
      dirs += sep + it;
    } else {
      dirs += sep + prefix + it;
    }
    sep = ";";
  }
  return dirs;
}